

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reshape.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeReshape(ConvertLayerParameters layerParameters)

{
  int iVar1;
  Rep *pRVar2;
  string *psVar3;
  string *psVar4;
  Type *pTVar5;
  NeuralNetworkLayer *this;
  BlobShape *pBVar6;
  BlobShape *pBVar7;
  int64 iVar8;
  ReshapeLayerParams *this_00;
  void **ppvVar9;
  ReshapeParameter *pRVar10;
  long lVar11;
  long lVar12;
  allocator local_b9;
  string local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                      *layerParameters.layerId);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (layerParameters.nnWrite);
  if (((pTVar5->bottom_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
     ((pTVar5->top_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    lVar12 = 1;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_b8,"Must have 1 input and 1 output",(allocator *)&local_98);
    errorInCaffeProto(&local_b8,(pTVar5->name_).ptr_,(pTVar5->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_b8);
    lVar12 = (long)(pTVar5->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar5->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  for (lVar11 = 0; lVar12 * 8 != lVar11; lVar11 = lVar11 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&bottom,*(value_type **)((long)ppvVar9 + lVar11));
  }
  pRVar2 = (pTVar5->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  iVar1 = (pTVar5->top_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar12 = 0; (long)iVar1 * 8 != lVar12; lVar12 = lVar12 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&top,*(value_type **)((long)ppvVar9 + lVar12));
  }
  convertCaffeMetadata
            ((pTVar5->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  pRVar10 = pTVar5->reshape_param_;
  if (pRVar10 == (ReshapeParameter *)0x0) {
    pRVar10 = (ReshapeParameter *)&caffe::_ReshapeParameter_default_instance_;
  }
  if (pRVar10->axis_ != 0) {
    std::__cxx11::string::string((string *)&local_b8,"axis",&local_b9);
    psVar3 = (pTVar5->name_).ptr_;
    psVar4 = (pTVar5->type_).ptr_;
    std::__cxx11::to_string(&local_98,pRVar10->axis_);
    unsupportedCaffeParrameterWithOption(&local_b8,psVar3,psVar4,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if (pRVar10->num_axes_ != -1) {
    std::__cxx11::string::string((string *)&local_b8,"num_axes",&local_b9);
    psVar3 = (pTVar5->name_).ptr_;
    psVar4 = (pTVar5->type_).ptr_;
    std::__cxx11::to_string(&local_98,pRVar10->num_axes_);
    unsupportedCaffeParrameterWithOption(&local_b8,psVar3,psVar4,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  pBVar7 = pRVar10->shape_;
  pBVar6 = pBVar7;
  if (pBVar7 == (BlobShape *)0x0) {
    pBVar6 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar6->dim_).current_size_ != 4) {
    std::__cxx11::string::string((string *)&local_b8,"shape size",&local_b9);
    pBVar7 = pRVar10->shape_;
    if (pBVar7 == (BlobShape *)0x0) {
      pBVar7 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    psVar3 = (pTVar5->name_).ptr_;
    psVar4 = (pTVar5->type_).ptr_;
    std::__cxx11::to_string(&local_98,(pBVar7->dim_).current_size_);
    unsupportedCaffeParrameterWithOption(&local_b8,psVar3,psVar4,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    pBVar7 = pRVar10->shape_;
  }
  if (pBVar7 == (BlobShape *)0x0) {
    pBVar7 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  iVar8 = caffe::BlobShape::dim(pBVar7,0);
  if (iVar8 != 0) {
    std::__cxx11::string::string((string *)&local_b8,"shape dims[0]",&local_b9);
    pBVar7 = pRVar10->shape_;
    if (pBVar7 == (BlobShape *)0x0) {
      pBVar7 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    psVar3 = (pTVar5->name_).ptr_;
    psVar4 = (pTVar5->type_).ptr_;
    iVar8 = caffe::BlobShape::dim(pBVar7,0);
    std::__cxx11::to_string(&local_98,iVar8);
    unsupportedCaffeParrameterWithOption(&local_b8,psVar3,psVar4,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  pBVar7 = pRVar10->shape_;
  if (pBVar7 == (BlobShape *)0x0) {
    pBVar7 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  iVar8 = caffe::BlobShape::dim(pBVar7,1);
  if (0 < iVar8) {
    pBVar7 = pRVar10->shape_;
    if (pBVar7 == (BlobShape *)0x0) {
      pBVar7 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    iVar8 = caffe::BlobShape::dim(pBVar7,2);
    if (0 < iVar8) {
      pBVar7 = pRVar10->shape_;
      if (pBVar7 == (BlobShape *)0x0) {
        pBVar7 = (BlobShape *)&caffe::_BlobShape_default_instance_;
      }
      iVar8 = caffe::BlobShape::dim(pBVar7,3);
      if (0 < iVar8) goto LAB_00484497;
    }
  }
  std::__cxx11::string::string
            ((string *)&local_b8,"shape dims[0], dims[1], dims[2] must all be positve",
             (allocator *)&local_98);
  unsupportedCaffeParrameter(&local_b8,(pTVar5->name_).ptr_,(pTVar5->type_).ptr_);
  std::__cxx11::string::~string((string *)&local_b8);
LAB_00484497:
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_reshape(this);
  pBVar7 = pRVar10->shape_;
  if (pBVar7 == (BlobShape *)0x0) {
    pBVar7 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  iVar8 = caffe::BlobShape::dim(pBVar7,1);
  CoreML::Specification::ReshapeLayerParams::add_targetshape(this_00,iVar8);
  pBVar7 = pRVar10->shape_;
  if (pBVar7 == (BlobShape *)0x0) {
    pBVar7 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  iVar8 = caffe::BlobShape::dim(pBVar7,2);
  CoreML::Specification::ReshapeLayerParams::add_targetshape(this_00,iVar8);
  pBVar7 = pRVar10->shape_;
  if (pBVar7 == (BlobShape *)0x0) {
    pBVar7 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  iVar8 = caffe::BlobShape::dim(pBVar7,3);
  CoreML::Specification::ReshapeLayerParams::add_targetshape(this_00,iVar8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&top);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bottom);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeReshape(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::ReshapeParameter& caffeLayerParams = caffeLayer.reshape_param();
    
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.axis() != 0){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.num_axes() != -1){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("num_axes",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.num_axes()));
    }
    if (caffeLayerParams.shape().dim_size() != 4){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("shape size",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.shape().dim_size()));
    }
    if (caffeLayerParams.shape().dim(0) != 0){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("shape dims[0]",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.shape().dim(0)));
    }
    if (!(caffeLayerParams.shape().dim(1) > 0 && caffeLayerParams.shape().dim(2) > 0 && caffeLayerParams.shape().dim(3) > 0)){
        CoreMLConverter::unsupportedCaffeParrameter("shape dims[0], dims[1], dims[2] must all be positve",caffeLayer.name(),caffeLayer.type());
    }
    //***************************************************************
    
    Specification::ReshapeLayerParams* specLayerParams = specLayer->mutable_reshape();
    specLayerParams->add_targetshape(caffeLayerParams.shape().dim(1)); //C
    specLayerParams->add_targetshape(caffeLayerParams.shape().dim(2)); //H
    specLayerParams->add_targetshape(caffeLayerParams.shape().dim(3)); //W
    
}